

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O1

BYTE __thiscall EncoderMD::GetMod(EncoderMD *this,size_t offset,bool regIsRbpOrR13,int *pDispSize)

{
  code *pcVar1;
  BYTE BVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (offset == 0 && !regIsRbpOrR13) {
    *pDispSize = 0;
    BVar2 = '\0';
  }
  else if ((long)(char)offset == offset) {
    *pDispSize = 1;
    BVar2 = '@';
  }
  else if ((long)(int)offset == offset) {
    *pDispSize = 4;
    BVar2 = 0x80;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x121,"(0)","Cannot encode offsets more than 32 bits in MODRM");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    BVar2 = 0xff;
  }
  return BVar2;
}

Assistant:

BYTE
EncoderMD::GetMod(size_t offset, bool regIsRbpOrR13, int * pDispSize)
{
    if (offset == 0 && !regIsRbpOrR13)
    {
        *(pDispSize) = 0;
        return Mod00;
    }
    else if (this->FitsInByte(offset))
    {
        *(pDispSize) = 1;
        return Mod01;
    }
    else if(Math::FitsInDWord(offset))
    {
        *(pDispSize) = 4;
        return Mod10;
    }
    else
    {
        AssertMsg(0, "Cannot encode offsets more than 32 bits in MODRM");
        return 0xff;
    }
}